

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  bool *pbVar1;
  pointer pMVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  Allocator *pAVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  void *pvVar14;
  int iVar15;
  int *piVar16;
  ulong uVar17;
  size_t i_2;
  ulong uVar18;
  NetPrivate *this_00;
  NetPrivate *pNVar19;
  NetPrivate *pNVar20;
  void *in_R8;
  size_t i;
  pointer pMVar21;
  long lVar22;
  pointer pMVar23;
  pointer pcVar24;
  bool bVar25;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  allocator_type local_d9;
  Mat local_d8;
  pointer local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  Allocator *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int local_50;
  pointer local_48;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    this_00 = (NetPrivate *)&stack0xffffffffffffff78;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)this_00,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_d8);
    lVar22 = 0;
    uVar18 = 0;
    local_38 = (pointer)blob_mats;
    while( true ) {
      pcVar24 = local_38;
      pMVar21 = local_88;
      piVar6 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar17 = (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      if (uVar17 <= uVar18) break;
      pMVar23 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_38->name)->_M_impl).
                super__Vector_impl_data._M_start + piVar6[uVar18];
      piVar16 = *(int **)((long)&local_88->refcount + lVar22);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          this_00 = *(NetPrivate **)((long)&local_88->data + lVar22);
          pNVar19 = *(NetPrivate **)((long)&local_88->allocator + lVar22);
          if (pNVar19 == (NetPrivate *)0x0) {
            free(this_00);
          }
          else {
            (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt)->
                          _M_impl).super__Vector_impl_data._M_start)->elempack)();
            this_00 = pNVar19;
          }
        }
      }
      pbVar1 = (bool *)((long)&pMVar21->data + lVar22);
      *(undefined8 *)((long)&pMVar21->cstep + lVar22) = 0;
      *(undefined8 *)(pbVar1 + 0xc) = 0;
      *(undefined8 *)(pbVar1 + 0x14) = 0;
      *(undefined8 *)pbVar1 = 0;
      *(Allocator **)(pbVar1 + 8) = (Allocator *)0x0;
      *(undefined4 *)((long)&pMVar21->c + lVar22) = 0;
      *(undefined8 *)((long)&pMVar21->dims + lVar22) = 0;
      *(undefined8 *)((bool *)((long)&pMVar21->dims + lVar22) + 8) = 0;
      if (((opt->lightmode == true) && (layer->support_inplace == true)) &&
         (*pMVar23->refcount != 1)) {
        this_00 = (NetPrivate *)&local_d8;
        Mat::clone(&local_d8,(__fn *)pMVar23,opt->blob_allocator,(int)uVar17,opt);
        pMVar21 = local_88;
        pNVar19 = (NetPrivate *)((long)&local_88->data + lVar22);
        piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (pNVar19 != (NetPrivate *)&local_d8) {
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = *(int **)((long)&local_88->refcount + lVar22);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              this_00 = *(NetPrivate **)((long)&local_88->data + lVar22);
              pNVar20 = *(NetPrivate **)((long)&local_88->allocator + lVar22);
              if (pNVar20 == (NetPrivate *)0x0) {
                free(this_00);
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar20->opt
                               )->_M_impl).super__Vector_impl_data._M_start)->elempack)();
                this_00 = pNVar20;
              }
            }
          }
          *(undefined8 *)((long)&pMVar21->cstep + lVar22) = 0;
          *(undefined8 *)
           ((long)&(pNVar19->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                   _M_impl.super__Vector_impl_data._M_start + 4) = 0;
          *(undefined8 *)
           ((long)&(pNVar19->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
          pNVar19->opt = (Option *)0x0;
          (pNVar19->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          *(undefined8 *)((long)&pMVar21->dims + lVar22) = 0;
          *(undefined8 *)((bool *)((long)&pMVar21->dims + lVar22) + 8) = 0;
          *(undefined4 *)((long)&pMVar21->c + lVar22) = 0;
          *(void **)((long)&pMVar21->data + lVar22) = local_d8.data;
          piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          *(int **)((long)&pMVar21->refcount + lVar22) = piVar16;
          *(ulong *)((long)&pMVar21->elemsize + lVar22) =
               CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          *(int *)((long)&pMVar21->elempack + lVar22) = local_d8.elempack;
          *(Allocator **)((long)&pMVar21->allocator + lVar22) = local_d8.allocator;
          pbVar1 = (bool *)((long)&pMVar21->dims + lVar22);
          *(int *)pbVar1 = local_d8.dims;
          *(int *)(pbVar1 + 4) = local_d8.w;
          *(int *)(pbVar1 + 8) = local_d8.h;
          *(int *)(pbVar1 + 0xc) = local_d8.d;
          *(int *)((long)&pMVar21->c + lVar22) = local_d8.c;
          *(size_t *)((long)&pMVar21->cstep + lVar22) = local_d8.cstep;
        }
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if ((NetPrivate *)local_d8.allocator == (NetPrivate *)0x0) {
              this_00 = (NetPrivate *)local_d8.data;
              free(local_d8.data);
            }
            else {
              this_00 = (NetPrivate *)local_d8.allocator;
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                             &(local_d8.allocator)->_vptr_Allocator)->_M_impl).
                            super__Vector_impl_data._M_start)->elempack)();
            }
          }
        }
      }
      pMVar21 = local_88;
      if ((*(int *)((long)&local_88->dims + lVar22) == 0) &&
         (pMVar2 = (pointer)((long)&local_88->data + lVar22), pMVar2 != pMVar23)) {
        piVar16 = pMVar23->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = *(int **)((long)&local_88->refcount + lVar22);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            this_00 = *(NetPrivate **)((long)&local_88->data + lVar22);
            pNVar19 = *(NetPrivate **)((long)&local_88->allocator + lVar22);
            if (pNVar19 == (NetPrivate *)0x0) {
              free(this_00);
            }
            else {
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
              this_00 = pNVar19;
            }
          }
        }
        pbVar1 = (bool *)((long)&pMVar21->data + lVar22);
        *(undefined8 *)(pbVar1 + 0x40) = 0;
        *(undefined8 *)((long)&pMVar2->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar2->elemsize + 4) = 0;
        pMVar2->data = (void *)0x0;
        pMVar2->refcount = (int *)0x0;
        *(undefined4 *)(pbVar1 + 0x38) = 0;
        *(undefined8 *)(pbVar1 + 0x28) = 0;
        *(undefined8 *)(pbVar1 + 0x30) = 0;
        pAVar7 = (Allocator *)pMVar23->refcount;
        *(void **)pbVar1 = pMVar23->data;
        *(Allocator **)(pbVar1 + 8) = pAVar7;
        *(Allocator **)(pbVar1 + 0x10) = (Allocator *)pMVar23->elemsize;
        *(int *)(pbVar1 + 0x18) = pMVar23->elempack;
        *(Allocator **)(pbVar1 + 0x20) = pMVar23->allocator;
        uVar8 = *(undefined8 *)&pMVar23->h;
        *(undefined8 *)(pbVar1 + 0x28) = *(undefined8 *)&pMVar23->dims;
        *(undefined8 *)(pbVar1 + 0x30) = uVar8;
        *(int *)(pbVar1 + 0x38) = pMVar23->c;
        *(size_t *)(pbVar1 + 0x40) = pMVar23->cstep;
      }
      convert_layout(this_00,(Mat *)((long)&local_88->data + lVar22),layer,opt);
      uVar18 = uVar18 + 1;
      lVar22 = lVar22 + 0x48;
    }
    if ((opt->lightmode == false) || (layer->support_inplace != true)) {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8,
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_d9);
      iVar15 = (*layer->_vptr_Layer[6])(layer,&stack0xffffffffffffff78,&local_d8,opt);
      if (iVar15 == 0) {
        lVar22 = 0;
        for (uVar18 = 0; pvVar14 = local_d8.data,
            piVar6 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar18 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
            uVar18 = uVar18 + 1) {
          pMVar21 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar24->name)->
                    _M_impl).super__Vector_impl_data._M_start + piVar6[uVar18];
          if ((pointer)((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                local_d8.data)->_M_impl).super__Vector_impl_data._M_start + lVar22)
              != pMVar21) {
            piVar16 = *(int **)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                        ((long)local_d8.data + 8))->
                                       super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                       _M_impl.super__Vector_impl_data._M_start + lVar22);
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + 1;
              UNLOCK();
            }
            piVar16 = pMVar21->refcount;
            if (piVar16 != (int *)0x0) {
              LOCK();
              *piVar16 = *piVar16 + -1;
              UNLOCK();
              if (*piVar16 == 0) {
                if (pMVar21->allocator == (Allocator *)0x0) {
                  free(pMVar21->data);
                }
                else {
                  (*pMVar21->allocator->_vptr_Allocator[3])();
                }
              }
            }
            pMVar21->cstep = 0;
            pMVar21->data = (void *)0x0;
            pMVar21->refcount = (int *)0x0;
            *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
            pMVar21->c = 0;
            pMVar21->dims = 0;
            pMVar21->w = 0;
            pMVar21->h = 0;
            pMVar21->d = 0;
            puVar3 = (undefined8 *)
                     ((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar14)->
                             _M_impl).super__Vector_impl_data._M_start + lVar22);
            piVar16 = (int *)puVar3[1];
            pMVar21->data = (void *)*puVar3;
            pMVar21->refcount = piVar16;
            pMVar21->elemsize =
                 *(size_t *)
                  ((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)((long)pvVar14 + 8))
                          ->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
            pMVar21->elempack =
                 *(int *)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                  ((long)pvVar14 + 8))->
                                 super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar22);
            pMVar21->allocator =
                 *(Allocator **)
                  ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                           ((long)pvVar14 + 0x20))->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start + lVar22);
            puVar3 = (undefined8 *)
                     ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                              ((long)pvVar14 + 0x20))->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish + lVar22);
            uVar8 = *puVar3;
            uVar9 = puVar3[1];
            pMVar21->dims = (int)uVar8;
            pMVar21->w = (int)((ulong)uVar8 >> 0x20);
            pMVar21->h = (int)uVar9;
            pMVar21->d = (int)((ulong)uVar9 >> 0x20);
            pMVar21->c = *(int *)((long)&(((vector<int,_std::allocator<int>_> *)
                                          ((long)pvVar14 + 0x38))->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + lVar22);
            pMVar21->cstep =
                 *(size_t *)
                  ((long)&(((vector<int,_std::allocator<int>_> *)((long)pvVar14 + 0x38))->
                          super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish + lVar22);
          }
          lVar22 = lVar22 + 0x48;
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
        goto LAB_0016303e;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
LAB_00162f48:
      bVar25 = false;
    }
    else {
      iVar15 = (*layer->_vptr_Layer[8])(layer,&stack0xffffffffffffff78,opt);
      if (iVar15 != 0) goto LAB_00162f48;
      lVar22 = 0;
      for (uVar18 = 0; pMVar21 = local_88,
          piVar6 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar18 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
          uVar18 = uVar18 + 1) {
        pMVar23 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar24->name)->_M_impl)
                  .super__Vector_impl_data._M_start + piVar6[uVar18];
        if ((pointer)((long)&local_88->data + lVar22) != pMVar23) {
          piVar16 = *(int **)((long)&local_88->refcount + lVar22);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = pMVar23->refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (pMVar23->allocator == (Allocator *)0x0) {
                free(pMVar23->data);
              }
              else {
                (*pMVar23->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar23->cstep = 0;
          pMVar23->data = (void *)0x0;
          pMVar23->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
          pMVar23->c = 0;
          pMVar23->dims = 0;
          pMVar23->w = 0;
          pMVar23->h = 0;
          pMVar23->d = 0;
          pbVar1 = (bool *)((long)&pMVar21->data + lVar22);
          pAVar7 = *(Allocator **)(pbVar1 + 8);
          pMVar23->data = *(void **)pbVar1;
          pMVar23->refcount = (int *)pAVar7;
          pMVar23->elemsize = *(size_t *)((long)&pMVar21->elemsize + lVar22);
          pMVar23->elempack = *(int *)((long)&pMVar21->elempack + lVar22);
          pMVar23->allocator = *(Allocator **)((long)&pMVar21->allocator + lVar22);
          pbVar1 = (bool *)((long)&pMVar21->dims + lVar22);
          iVar15 = *(int *)(pbVar1 + 4);
          iVar4 = *(int *)(pbVar1 + 8);
          iVar5 = *(int *)(pbVar1 + 0xc);
          pMVar23->dims = *(int *)pbVar1;
          pMVar23->w = iVar15;
          pMVar23->h = iVar4;
          pMVar23->d = iVar5;
          pMVar23->c = *(int *)((long)&pMVar21->c + lVar22);
          pMVar23->cstep = *(size_t *)((long)&pMVar21->cstep + lVar22);
        }
        lVar22 = lVar22 + 0x48;
      }
LAB_0016303e:
      iVar15 = 0;
      for (uVar18 = 0;
          piVar6 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar18 < (ulong)((long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
          uVar18 = uVar18 + 1) {
        if (opt->lightmode == true) {
          iVar4 = piVar6[uVar18];
          pMVar23 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pcVar24->name)->
                    _M_impl).super__Vector_impl_data._M_start;
          pMVar21 = pMVar23 + iVar4;
          piVar16 = pMVar23[iVar4].refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              if (pMVar21->allocator == (Allocator *)0x0) {
                free(pMVar21->data);
              }
              else {
                (*pMVar21->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar21->cstep = 0;
          pMVar21->data = (void *)0x0;
          pMVar21->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
          pMVar21->dims = 0;
          pMVar21->w = 0;
          pMVar21->h = 0;
          pMVar21->d = 0;
          pMVar21->c = 0;
          pcVar24 = local_38;
        }
      }
      bVar25 = true;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff78);
    goto LAB_0016351a;
  }
  piVar16 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = *piVar16;
  local_d8.cstep = 0;
  pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + iVar4;
  local_d8.data = (pointer)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elemsize._4_4_ = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar21->refcount != 1)) {
    Mat::clone((Mat *)&stack0xffffffffffffff78,(__fn *)pMVar21,opt->blob_allocator,(int)piVar16,
               in_R8);
    piVar16 = (int *)CONCAT44(uStack_7c,uStack_80);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          free(local_d8.data);
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar16 = (int *)CONCAT44(uStack_7c,uStack_80);
    local_d8.data = local_88;
    local_d8.refcount._0_4_ = uStack_80;
    local_d8.refcount._4_4_ = uStack_7c;
    local_d8.elemsize._0_4_ = local_78;
    local_d8.elemsize._4_4_ = uStack_74;
    local_d8.elempack = local_70;
    local_d8.allocator = local_68;
    local_d8.dims = iStack_60;
    local_d8.w = iStack_5c;
    local_d8.h = iStack_58;
    local_d8.d = iStack_54;
    local_d8.c = local_50;
    local_d8.cstep = (size_t)local_48;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_68 == (Allocator *)0x0) {
          free(local_88);
        }
        else {
          (*local_68->_vptr_Allocator[3])();
        }
      }
    }
    bVar25 = local_d8.dims != 0;
  }
  else {
    bVar25 = false;
  }
  if ((!bVar25) && (&local_d8 != pMVar21)) {
    piVar16 = pMVar21->refcount;
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + 1;
      UNLOCK();
    }
    piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          free(local_d8.data);
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.data = pMVar21->data;
    local_d8.refcount._0_4_ = SUB84(pMVar21->refcount,0);
    local_d8.refcount._4_4_ = (undefined4)((ulong)pMVar21->refcount >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)pMVar21->elemsize;
    local_d8.elemsize._4_4_ = (undefined4)(pMVar21->elemsize >> 0x20);
    local_d8.elempack = pMVar21->elempack;
    local_d8.allocator = pMVar21->allocator;
    uVar10 = pMVar21->dims;
    uVar11 = pMVar21->w;
    uVar12 = pMVar21->h;
    uVar13 = pMVar21->d;
    local_d8.c = pMVar21->c;
    local_d8.cstep = pMVar21->cstep;
    local_d8.dims = uVar10;
    local_d8.w = uVar11;
    local_d8.h = uVar12;
    local_d8.d = uVar13;
  }
  convert_layout((NetPrivate *)opt,&local_d8,layer,opt);
  if ((opt->lightmode == true) && (layer->support_inplace == true)) {
    iVar15 = (*layer->_vptr_Layer[9])(layer,&local_d8,opt);
    if (iVar15 != 0) goto LAB_001632da;
    pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar5;
    if (pMVar21 != &local_d8) {
      piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + 1;
        UNLOCK();
      }
      piVar16 = pMVar21->refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            free(pMVar21->data);
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->c = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->data = local_d8.data;
      pMVar21->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      pMVar21->elemsize = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
      pMVar21->elempack = local_d8.elempack;
      pMVar21->allocator = local_d8.allocator;
      pMVar21->dims = local_d8.dims;
      pMVar21->w = local_d8.w;
      pMVar21->h = local_d8.h;
      pMVar21->d = local_d8.d;
      pMVar21->c = local_d8.c;
      pMVar21->cstep = local_d8.cstep;
    }
LAB_00163495:
    iVar15 = 0;
    bVar25 = true;
    if (opt->lightmode == true) {
      pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar21 = pMVar23 + iVar4;
      piVar16 = pMVar23[iVar4].refcount;
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            free(pMVar21->data);
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->c = 0;
    }
  }
  else {
    local_48 = (pointer)0x0;
    local_88 = (pointer)0x0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    local_70 = 0;
    local_68 = (Allocator *)0x0;
    iStack_60 = 0;
    iStack_5c = 0;
    iStack_58 = 0;
    _iStack_54 = 0;
    iVar15 = (*layer->_vptr_Layer[7])(layer,&local_d8,(pointer)&stack0xffffffffffffff78);
    if (iVar15 == 0) {
      pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + iVar5;
      piVar16 = (int *)CONCAT44(uStack_7c,uStack_80);
      if (pMVar21 != (pointer)&stack0xffffffffffffff78) {
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + 1;
          UNLOCK();
        }
        piVar16 = pMVar21->refcount;
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (pMVar21->allocator == (Allocator *)0x0) {
              free(pMVar21->data);
            }
            else {
              (*pMVar21->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar21->cstep = 0;
        pMVar21->data = (void *)0x0;
        pMVar21->refcount = (int *)0x0;
        *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
        pMVar21->dims = 0;
        pMVar21->w = 0;
        pMVar21->h = 0;
        pMVar21->d = 0;
        pMVar21->c = 0;
        pMVar21->data = local_88;
        piVar16 = (int *)CONCAT44(uStack_7c,uStack_80);
        pMVar21->refcount = piVar16;
        pMVar21->elemsize = CONCAT44(uStack_74,local_78);
        pMVar21->elempack = local_70;
        pMVar21->allocator = local_68;
        pMVar21->dims = iStack_60;
        pMVar21->w = iStack_5c;
        pMVar21->h = iStack_58;
        pMVar21->d = iStack_54;
        pMVar21->c = local_50;
        pMVar21->cstep = (size_t)local_48;
      }
      if (piVar16 != (int *)0x0) {
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 == 0) {
          if (local_68 == (Allocator *)0x0) {
            free(local_88);
          }
          else {
            (*local_68->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00163495;
    }
    piVar16 = (int *)CONCAT44(uStack_7c,uStack_80);
    if (piVar16 != (int *)0x0) {
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 == 0) {
        if (local_68 == (Allocator *)0x0) {
          free(local_88);
        }
        else {
          (*local_68->_vptr_Allocator[3])();
        }
      }
    }
LAB_001632da:
    bVar25 = false;
  }
  piVar16 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        free(local_d8.data);
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0016351a:
  if (bVar25) {
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        convert_layout(bottom_blob, layer, opt);

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            convert_layout(bottom_blobs[i], layer, opt);
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}